

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Maybe<capnp::ParsedSchema> * __thiscall
capnp::ParsedSchema::findNested
          (Maybe<capnp::ParsedSchema> *__return_storage_ptr__,ParsedSchema *this,StringPtr name)

{
  Impl *pIVar1;
  SchemaParser *pSVar2;
  Reader brand;
  undefined1 auVar3 [40];
  Schema SVar4;
  _func_int **pp_Var5;
  StringPtr childName;
  char local_70;
  uint64_t local_68;
  Reader local_60;
  
  pIVar1 = (this->parser->impl).ptr;
  Schema::getProto(&local_60,&this->super_Schema);
  if (local_60._reader.dataSize < 0x40) {
    pp_Var5 = (_func_int **)0x0;
  }
  else {
    pp_Var5 = *(_func_int ***)local_60._reader.data;
  }
  childName.content.size_ = (size_t)name.content.ptr;
  childName.content.ptr = (char *)pp_Var5;
  capnp::compiler::Compiler::lookup((Compiler *)&local_70,(uint64_t)&pIVar1->compiler,childName);
  if (local_70 == '\0') {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    auVar3 = ZEXT1640(ZEXT816(0));
    brand._reader._40_8_ = 0x7fffffff;
    brand._reader.segment = (SegmentReader *)auVar3._0_8_;
    brand._reader.capTable = (CapTableReader *)auVar3._8_8_;
    brand._reader.data = (void *)auVar3._16_8_;
    brand._reader.pointers = (WirePointer *)auVar3._24_8_;
    brand._reader.dataSize = auVar3._32_4_;
    brand._reader.pointerCount = auVar3._36_2_;
    brand._reader._38_2_ = auVar3._38_2_;
    SVar4 = SchemaLoader::get(&(((this->parser->impl).ptr)->compiler).loader,local_68,brand,
                              (Schema)0x649c50);
    pSVar2 = this->parser;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.super_Schema.raw = SVar4.raw;
    (__return_storage_ptr__->ptr).field_1.value.parser = pSVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<ParsedSchema> ParsedSchema::findNested(kj::StringPtr name) const {
  return parser->impl->compiler.lookup(getProto().getId(), name).map(
      [this](uint64_t childId) {
        return ParsedSchema(parser->impl->compiler.getLoader().get(childId), *parser);
      });
}